

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::UpdateWindowManualResize
               (ImGuiWindow *window,ImVec2 *size_auto_fit,int *border_held,int resize_grip_count,
               ImU32 *resize_grip_col,ImRect *visibility_rect)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiID IVar4;
  ImU32 IVar5;
  ImGuiMouseCursor IVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  ImRect IVar10;
  float local_224;
  float local_21c;
  float local_218;
  float local_210;
  ImGuiCol local_20c;
  float local_208;
  float local_200;
  float local_1fc;
  float local_1f4;
  float local_1d8;
  ImVec2 local_1bc;
  ImVec2 local_1b4;
  ImVec2 local_1ac;
  undefined4 local_1a4;
  ImVec2 IStack_1a0;
  float NAV_RESIZE_SPEED;
  ImVec2 local_198;
  ImVec2 local_190;
  ImVec2 nav_resize_delta;
  ImVec2 local_178;
  ImVec2 clamp_max_1;
  ImVec2 clamp_min_1;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 border_posn;
  ImVec2 border_target;
  ImRect border_rect;
  bool held_1;
  bool hovered_1;
  int border_n;
  ImVec2 local_110;
  ImVec2 clamp_max;
  ImVec2 clamp_min;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 corner_target;
  bool local_c2;
  bool local_c1;
  bool held;
  ImVec2 IStack_c0;
  bool hovered;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  undefined1 local_a0 [8];
  ImRect resize_rect;
  ImVec2 local_88;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  float fStack_70;
  int resize_grip_n;
  ImVec2 size_target;
  ImVec2 pos_target;
  float grip_hover_outer_size;
  float grip_hover_inner_size;
  float grip_draw_size;
  int resize_border_count;
  bool ret_auto_fit;
  ImGuiWindowFlags flags;
  ImGuiContext *g;
  ImRect *visibility_rect_local;
  ImU32 *resize_grip_col_local;
  int resize_grip_count_local;
  int *border_held_local;
  ImVec2 *size_auto_fit_local;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  if (((((window->Flags & 2U) != 0) || ((window->Flags & 0x40U) != 0)) ||
      ('\0' < window->AutoFitFramesX)) || ('\0' < window->AutoFitFramesY)) {
    return false;
  }
  if ((window->WasActive & 1U) == 0) {
    return false;
  }
  bVar1 = false;
  iVar3 = 0;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    iVar3 = 4;
  }
  fVar7 = ImMax<float>(GImGui->FontSize * 1.35,GImGui->FontSize * 0.2 + window->WindowRounding + 1.0
                      );
  fVar7 = (float)(int)((float)(int)fVar7 * 0.75);
  local_1d8 = 4.0;
  if (((pIVar2->IO).ConfigWindowsResizeFromEdges & 1U) == 0) {
    local_1d8 = 0.0;
  }
  ImVec2::ImVec2(&size_target,3.4028235e+38,3.4028235e+38);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,3.4028235e+38,3.4028235e+38);
  (window->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
  PushID("#RESIZE");
  for (grip._4_4_ = 0; (int)grip._4_4_ < resize_grip_count; grip._4_4_ = grip._4_4_ + 1) {
    corner = (ImVec2)(resize_grip_def + (int)grip._4_4_);
    resize_rect.Max = operator+(&window->Pos,&window->Size);
    local_88 = ImLerp(&window->Pos,&resize_rect.Max,(ImVec2 *)corner);
    local_b0 = ::operator*((ImVec2 *)((long)corner + 8),local_1d8);
    local_a8 = ::operator-(&local_88,&local_b0);
    IStack_c0 = ::operator*((ImVec2 *)((long)corner + 8),fVar7);
    local_b8 = operator+(&local_88,&stack0xffffffffffffff40);
    ImRect::ImRect((ImRect *)local_a0,&local_a8,&local_b8);
    if (resize_rect.Min.x < (float)local_a0._0_4_) {
      ImSwap<float>((float *)local_a0,(float *)&resize_rect);
    }
    if (resize_rect.Min.y < (float)local_a0._4_4_) {
      ImSwap<float>((float *)(local_a0 + 4),&resize_rect.Min.y);
    }
    IVar4 = ImGuiWindow::GetID(window,grip._4_4_);
    ButtonBehavior((ImRect *)local_a0,IVar4,&local_c1,&local_c2,0x40800);
    if (((local_c1 & 1U) != 0) || ((local_c2 & 1U) != 0)) {
      IVar6 = 6;
      if ((grip._4_4_ & 1) != 0) {
        IVar6 = 5;
      }
      pIVar2->MouseCursor = IVar6;
    }
    if ((((local_c2 & 1U) == 0) || (((pIVar2->IO).MouseDoubleClicked[0] & 1U) == 0)) ||
       (grip._4_4_ != 0)) {
      if ((local_c2 & 1U) != 0) {
        local_e8 = ::operator-(&(pIVar2->IO).MousePos,&pIVar2->ActiveIdClickOffset);
        local_f8 = ::operator*((ImVec2 *)((long)corner + 8),local_1d8);
        clamp_min = ::operator*((ImVec2 *)((long)corner + 8),-fVar7);
        local_f0 = ImLerp(&local_f8,&clamp_min,(ImVec2 *)corner);
        local_e0 = operator+(&local_e8,&local_f0);
        if ((*(float *)corner != 1.0) || (NAN(*(float *)corner))) {
          local_1f4 = -3.4028235e+38;
        }
        else {
          local_1f4 = (visibility_rect->Min).x;
        }
        if ((*(float *)((long)corner + 4) != 1.0) || (NAN(*(float *)((long)corner + 4)))) {
          local_1fc = -3.4028235e+38;
        }
        else {
          local_1fc = (visibility_rect->Min).y;
        }
        ImVec2::ImVec2(&clamp_max,local_1f4,local_1fc);
        if ((*(float *)corner != 0.0) || (NAN(*(float *)corner))) {
          local_200 = 3.4028235e+38;
        }
        else {
          local_200 = (visibility_rect->Max).x;
        }
        if ((*(float *)((long)corner + 4) != 0.0) || (NAN(*(float *)((long)corner + 4)))) {
          local_208 = 3.4028235e+38;
        }
        else {
          local_208 = (visibility_rect->Max).y;
        }
        ImVec2::ImVec2(&local_110,local_200,local_208);
        local_e0 = ImClamp(&local_e0,&clamp_max,local_110);
        CalcResizePosSizeFromAnyCorner
                  (window,&local_e0,(ImVec2 *)corner,&size_target,(ImVec2 *)&stack0xffffffffffffff90
                  );
      }
    }
    else {
      corner_target = *size_auto_fit;
      _fStack_70 = CalcWindowSizeAfterConstraint(window,corner_target);
      bVar1 = true;
      ClearActiveID();
    }
    if (((grip._4_4_ == 0) || ((local_c2 & 1U) != 0)) || ((local_c1 & 1U) != 0)) {
      if ((local_c2 & 1U) == 0) {
        local_20c = 0x1e;
        if ((local_c1 & 1U) != 0) {
          local_20c = 0x1f;
        }
      }
      else {
        local_20c = 0x20;
      }
      IVar5 = GetColorU32(local_20c,1.0);
      resize_grip_col[(int)grip._4_4_] = IVar5;
    }
  }
  for (border_rect.Max.y = 0.0; (int)border_rect.Max.y < iVar3;
      border_rect.Max.y = (float)((int)border_rect.Max.y + 1)) {
    IVar10 = GetResizeBorderRect(window,(int)border_rect.Max.y,fVar7,4.0);
    border_target = IVar10.Min;
    border_rect.Min = IVar10.Max;
    IVar4 = ImGuiWindow::GetID(window,(int)border_rect.Max.y + 4);
    ButtonBehavior((ImRect *)&border_target,IVar4,(bool *)((long)&border_rect.Max.x + 3),
                   (bool *)((long)&border_rect.Max.x + 2),0x800);
    if ((((border_rect.Max.x._3_1_ & 1) != 0) && (0.04 < pIVar2->HoveredIdTimer)) ||
       ((border_rect.Max.x._2_1_ & 1) != 0)) {
      IVar6 = 3;
      if (((uint)border_rect.Max.y & 1) != 0) {
        IVar6 = 4;
      }
      pIVar2->MouseCursor = IVar6;
      if ((border_rect.Max.x._2_1_ & 1) != 0) {
        *border_held = (int)border_rect.Max.y;
      }
    }
    if ((border_rect.Max.x._2_1_ & 1) != 0) {
      border_posn = window->Pos;
      ImVec2::ImVec2(&local_148);
      if (border_rect.Max.y == 0.0) {
        ImVec2::ImVec2(&local_150,0.0,0.0);
        local_148 = local_150;
        border_posn.y = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) + 4.0;
      }
      if (border_rect.Max.y == 1.4013e-45) {
        ImVec2::ImVec2(&local_158,1.0,0.0);
        local_148 = local_158;
        border_posn.x = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) + 4.0;
      }
      if (border_rect.Max.y == 2.8026e-45) {
        ImVec2::ImVec2(&local_160,0.0,1.0);
        local_148 = local_160;
        border_posn.y = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) + 4.0;
      }
      if (border_rect.Max.y == 4.2039e-45) {
        ImVec2::ImVec2(&clamp_min_1,0.0,0.0);
        local_148 = clamp_min_1;
        border_posn.x = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) + 4.0;
      }
      if (border_rect.Max.y == 1.4013e-45) {
        local_210 = (visibility_rect->Min).x;
      }
      else {
        local_210 = -3.4028235e+38;
      }
      if (border_rect.Max.y == 2.8026e-45) {
        local_218 = (visibility_rect->Min).y;
      }
      else {
        local_218 = -3.4028235e+38;
      }
      ImVec2::ImVec2(&clamp_max_1,local_210,local_218);
      if (border_rect.Max.y == 4.2039e-45) {
        local_21c = (visibility_rect->Max).x;
      }
      else {
        local_21c = 3.4028235e+38;
      }
      if (border_rect.Max.y == 0.0) {
        local_224 = (visibility_rect->Max).y;
      }
      else {
        local_224 = 3.4028235e+38;
      }
      ImVec2::ImVec2(&local_178,local_21c,local_224);
      nav_resize_delta = local_178;
      border_posn = ImClamp(&border_posn,&clamp_max_1,local_178);
      CalcResizePosSizeFromAnyCorner
                (window,&border_posn,&local_148,&size_target,(ImVec2 *)&stack0xffffffffffffff90);
    }
  }
  PopID();
  (window->DC).NavLayerCurrent = ImGuiNavLayer_Main;
  if ((pIVar2->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar2->NavWindowingTarget->RootWindow == window)) {
    ImVec2::ImVec2(&local_190);
    if ((pIVar2->NavInputSource == ImGuiInputSource_NavKeyboard) &&
       (((pIVar2->IO).KeyShift & 1U) != 0)) {
      local_198 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      local_190 = local_198;
    }
    if (pIVar2->NavInputSource == ImGuiInputSource_NavGamepad) {
      IStack_1a0 = GetNavInputAmount2d(2,ImGuiInputReadMode_Down,0.0,0.0);
      local_190 = IStack_1a0;
    }
    if ((local_190.x == 0.0) && (!NAN(local_190.x))) {
      if ((local_190.y == 0.0) && (!NAN(local_190.y))) goto LAB_0017877a;
    }
    local_1a4 = 0x44160000;
    fVar7 = (pIVar2->IO).DeltaTime;
    fVar8 = ImMin<float>((pIVar2->IO).DisplayFramebufferScale.x,
                         (pIVar2->IO).DisplayFramebufferScale.y);
    fVar7 = ImFloor(fVar7 * 600.0 * fVar8);
    operator*=(&local_190,fVar7);
    local_1bc = ::operator-(&visibility_rect->Min,&window->Pos);
    local_1b4 = ::operator-(&local_1bc,&window->Size);
    local_1ac = ImMax(&local_190,&local_1b4);
    pIVar2->NavWindowingToggleLayer = false;
    pIVar2->NavDisableMouseHover = true;
    local_190 = local_1ac;
    IVar5 = GetColorU32(0x20,1.0);
    *resize_grip_col = IVar5;
    IVar9 = operator+(&window->SizeFull,&local_190);
    _fStack_70 = CalcWindowSizeAfterConstraint(window,IVar9);
  }
LAB_0017877a:
  if ((fStack_70 != 3.4028235e+38) || (NAN(fStack_70))) {
    window->SizeFull = _fStack_70;
    MarkIniSettingsDirty(window);
  }
  if ((size_target.x != 3.4028235e+38) || (NAN(size_target.x))) {
    IVar9 = ImFloor(&size_target);
    window->Pos = IVar9;
    MarkIniSettingsDirty(window);
  }
  window->Size = window->SizeFull;
  return bVar1;
}

Assistant:

static bool ImGui::UpdateWindowManualResize(ImGuiWindow* window, const ImVec2& size_auto_fit, int* border_held, int resize_grip_count, ImU32 resize_grip_col[4], const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindowFlags flags = window->Flags;

    if ((flags & ImGuiWindowFlags_NoResize) || (flags & ImGuiWindowFlags_AlwaysAutoResize) || window->AutoFitFramesX > 0 || window->AutoFitFramesY > 0)
        return false;
    if (window->WasActive == false) // Early out to avoid running this code for e.g. an hidden implicit/fallback Debug window.
        return false;

    bool ret_auto_fit = false;
    const int resize_border_count = g.IO.ConfigWindowsResizeFromEdges ? 4 : 0;
    const float grip_draw_size = IM_FLOOR(ImMax(g.FontSize * 1.35f, window->WindowRounding + 1.0f + g.FontSize * 0.2f));
    const float grip_hover_inner_size = IM_FLOOR(grip_draw_size * 0.75f);
    const float grip_hover_outer_size = g.IO.ConfigWindowsResizeFromEdges ? WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS : 0.0f;

    ImVec2 pos_target(FLT_MAX, FLT_MAX);
    ImVec2 size_target(FLT_MAX, FLT_MAX);

    // Resize grips and borders are on layer 1
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;

    // Manual resize grips
    PushID("#RESIZE");
    for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
    {
        const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
        const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPosN);

        // Using the FlattenChilds button flag we make the resize button accessible even if we are hovering over a child window
        ImRect resize_rect(corner - grip.InnerDir * grip_hover_outer_size, corner + grip.InnerDir * grip_hover_inner_size);
        if (resize_rect.Min.x > resize_rect.Max.x) ImSwap(resize_rect.Min.x, resize_rect.Max.x);
        if (resize_rect.Min.y > resize_rect.Max.y) ImSwap(resize_rect.Min.y, resize_rect.Max.y);
        bool hovered, held;
        ButtonBehavior(resize_rect, window->GetID(resize_grip_n), &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_NoNavFocus);
        //GetForegroundDrawList(window)->AddRect(resize_rect.Min, resize_rect.Max, IM_COL32(255, 255, 0, 255));
        if (hovered || held)
            g.MouseCursor = (resize_grip_n & 1) ? ImGuiMouseCursor_ResizeNESW : ImGuiMouseCursor_ResizeNWSE;

        if (held && g.IO.MouseDoubleClicked[0] && resize_grip_n == 0)
        {
            // Manual auto-fit when double-clicking
            size_target = CalcWindowSizeAfterConstraint(window, size_auto_fit);
            ret_auto_fit = true;
            ClearActiveID();
        }
        else if (held)
        {
            // Resize from any of the four corners
            // We don't use an incremental MouseDelta but rather compute an absolute target size based on mouse position
            ImVec2 corner_target = g.IO.MousePos - g.ActiveIdClickOffset + ImLerp(grip.InnerDir * grip_hover_outer_size, grip.InnerDir * -grip_hover_inner_size, grip.CornerPosN); // Corner of the window corresponding to our corner grip
            ImVec2 clamp_min = ImVec2(grip.CornerPosN.x == 1.0f ? visibility_rect.Min.x : -FLT_MAX, grip.CornerPosN.y == 1.0f ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max = ImVec2(grip.CornerPosN.x == 0.0f ? visibility_rect.Max.x : +FLT_MAX, grip.CornerPosN.y == 0.0f ? visibility_rect.Max.y : +FLT_MAX);
            corner_target = ImClamp(corner_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, corner_target, grip.CornerPosN, &pos_target, &size_target);
        }
        if (resize_grip_n == 0 || held || hovered)
            resize_grip_col[resize_grip_n] = GetColorU32(held ? ImGuiCol_ResizeGripActive : hovered ? ImGuiCol_ResizeGripHovered : ImGuiCol_ResizeGrip);
    }
    for (int border_n = 0; border_n < resize_border_count; border_n++)
    {
        bool hovered, held;
        ImRect border_rect = GetResizeBorderRect(window, border_n, grip_hover_inner_size, WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS);
        ButtonBehavior(border_rect, window->GetID(border_n + 4), &hovered, &held, ImGuiButtonFlags_FlattenChildren);
        //GetForegroundDrawLists(window)->AddRect(border_rect.Min, border_rect.Max, IM_COL32(255, 255, 0, 255));
        if ((hovered && g.HoveredIdTimer > WINDOWS_RESIZE_FROM_EDGES_FEEDBACK_TIMER) || held)
        {
            g.MouseCursor = (border_n & 1) ? ImGuiMouseCursor_ResizeEW : ImGuiMouseCursor_ResizeNS;
            if (held)
                *border_held = border_n;
        }
        if (held)
        {
            ImVec2 border_target = window->Pos;
            ImVec2 border_posn;
            if (border_n == 0) { border_posn = ImVec2(0, 0); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Top
            if (border_n == 1) { border_posn = ImVec2(1, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Right
            if (border_n == 2) { border_posn = ImVec2(0, 1); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Bottom
            if (border_n == 3) { border_posn = ImVec2(0, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Left
            ImVec2 clamp_min = ImVec2(border_n == 1 ? visibility_rect.Min.x : -FLT_MAX, border_n == 2 ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max = ImVec2(border_n == 3 ? visibility_rect.Max.x : +FLT_MAX, border_n == 0 ? visibility_rect.Max.y : +FLT_MAX);
            border_target = ImClamp(border_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, border_target, border_posn, &pos_target, &size_target);
        }
    }
    PopID();

    // Restore nav layer
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;

    // Navigation resize (keyboard/gamepad)
    if (g.NavWindowingTarget && g.NavWindowingTarget->RootWindow == window)
    {
        ImVec2 nav_resize_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && g.IO.KeyShift)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_Down);
        if (nav_resize_delta.x != 0.0f || nav_resize_delta.y != 0.0f)
        {
            const float NAV_RESIZE_SPEED = 600.0f;
            nav_resize_delta *= ImFloor(NAV_RESIZE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y));
            nav_resize_delta = ImMax(nav_resize_delta, visibility_rect.Min - window->Pos - window->Size);
            g.NavWindowingToggleLayer = false;
            g.NavDisableMouseHover = true;
            resize_grip_col[0] = GetColorU32(ImGuiCol_ResizeGripActive);
            // FIXME-NAV: Should store and accumulate into a separate size buffer to handle sizing constraints properly, right now a constraint will make us stuck.
            size_target = CalcWindowSizeAfterConstraint(window, window->SizeFull + nav_resize_delta);
        }
    }

    // Apply back modified position/size to window
    if (size_target.x != FLT_MAX)
    {
        window->SizeFull = size_target;
        MarkIniSettingsDirty(window);
    }
    if (pos_target.x != FLT_MAX)
    {
        window->Pos = ImFloor(pos_target);
        MarkIniSettingsDirty(window);
    }

    window->Size = window->SizeFull;
    return ret_auto_fit;
}